

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.cpp
# Opt level: O0

void __thiscall
QAbstractItemModelPrivate::itemsMoved
          (QAbstractItemModelPrivate *this,QModelIndex *sourceParent,int sourceFirst,int sourceLast,
          QModelIndex *destinationParent,int destinationChild,Orientation orientation)

{
  long lVar1;
  long in_FS_OFFSET;
  int destination_change;
  int source_change;
  int explicit_change;
  bool movingUp;
  bool sameParent;
  QList<QPersistentModelIndexData_*> moved_explicitly;
  QList<QPersistentModelIndexData_*> moved_in_source;
  QList<QPersistentModelIndexData_*> moved_in_destination;
  QModelIndex *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  Orientation orientation_00;
  QModelIndex *parent;
  int change;
  QList<QPersistentModelIndexData_*> *in_stack_ffffffffffffffd0;
  QAbstractItemModelPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAbstractItemModelPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QStack<QList<QPersistentModelIndexData_*>_>::pop
            ((QStack<QList<QPersistentModelIndexData_*>_> *)in_stack_ffffffffffffff28);
  change = -0x55555556;
  orientation_00 = 0xaaaaaaaa;
  parent = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QStack<QList<QPersistentModelIndexData_*>_>::pop
            ((QStack<QList<QPersistentModelIndexData_*>_> *)in_stack_ffffffffffffff28);
  QStack<QList<QPersistentModelIndexData_*>_>::pop
            ((QStack<QList<QPersistentModelIndexData_*>_> *)in_stack_ffffffffffffff28);
  ::operator==((QModelIndex *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
  movePersistentIndexes(this_00,in_stack_ffffffffffffffd0,change,parent,orientation_00);
  movePersistentIndexes(this_00,in_stack_ffffffffffffffd0,change,parent,orientation_00);
  movePersistentIndexes(this_00,in_stack_ffffffffffffffd0,change,parent,orientation_00);
  QList<QPersistentModelIndexData_*>::~QList((QList<QPersistentModelIndexData_*> *)0x7ef629);
  QList<QPersistentModelIndexData_*>::~QList((QList<QPersistentModelIndexData_*> *)0x7ef636);
  QList<QPersistentModelIndexData_*>::~QList((QList<QPersistentModelIndexData_*> *)0x7ef643);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelPrivate::itemsMoved(const QModelIndex &sourceParent, int sourceFirst, int sourceLast, const QModelIndex &destinationParent, int destinationChild, Qt::Orientation orientation)
{
    const QList<QPersistentModelIndexData *> moved_in_destination = persistent.moved.pop();
    const QList<QPersistentModelIndexData *> moved_in_source = persistent.moved.pop();
    const QList<QPersistentModelIndexData *> moved_explicitly = persistent.moved.pop();

    const bool sameParent = (sourceParent == destinationParent);
    const bool movingUp = (sourceFirst > destinationChild);

    const int explicit_change = (!sameParent || movingUp) ? destinationChild - sourceFirst : destinationChild - sourceLast - 1 ;
    const int source_change = (!sameParent || !movingUp) ? -1*(sourceLast - sourceFirst + 1) : sourceLast - sourceFirst + 1 ;
    const int destination_change = sourceLast - sourceFirst + 1;

    movePersistentIndexes(moved_explicitly, explicit_change, destinationParent, orientation);
    movePersistentIndexes(moved_in_source, source_change, sourceParent, orientation);
    movePersistentIndexes(moved_in_destination, destination_change, destinationParent, orientation);
}